

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# service_registry.hpp
# Opt level: O0

service * asio::detail::service_registry::create<asio::detail::scheduler,asio::execution_context>
                    (void *owner)

{
  service *psVar1;
  int unaff_retaddr;
  execution_context *in_stack_00000008;
  scheduler *in_stack_00000010;
  
  psVar1 = (service *)operator_new(0xd8);
  scheduler::scheduler(in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return psVar1;
}

Assistant:

execution_context::service* service_registry::create(void* owner)
{
  return new Service(*static_cast<Owner*>(owner));
}